

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall
libcellml::Generator::GeneratorImpl::addImplementationVoiInfoCode(GeneratorImpl *this)

{
  bool bVar1;
  VariablePtr voiVariable;
  string name;
  string component;
  string units;
  string type;
  allocator<char> local_161;
  __shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> local_160;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  bVar1 = modelHasOdes(this);
  if (bVar1) {
    GeneratorProfile::implementationVoiInfoString_abi_cxx11_
              (&local_150,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (local_150._M_string_length != 0) {
      GeneratorProfile::variableInfoEntryString_abi_cxx11_
                (&local_110,
                 (this->mProfile).
                 super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if (local_110._M_string_length != 0) {
        GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_
                  (&local_130,
                   (this->mProfile).
                   super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_150);
        if (local_130._M_string_length == 0) {
          return;
        }
        AnalyserModel::voi((AnalyserModel *)&local_150);
        AnalyserVariable::variable((AnalyserVariable *)&local_160);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_150._M_string_length);
        NamedEntity::name_abi_cxx11_(&local_150,&(local_160._M_ptr)->super_NamedEntity);
        Variable::units((Variable *)&local_130);
        NamedEntity::name_abi_cxx11_(&local_110,(NamedEntity *)local_130._M_dataplus._M_p);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length);
        std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libcellml::Variable,void>
                  ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
                   &local_d0,&local_160);
        owningComponent((ParentedEntityConstPtr *)&local_f0);
        NamedEntity::name_abi_cxx11_(&local_130,(NamedEntity *)local_f0._M_dataplus._M_p);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
        GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_
                  (&local_f0,
                   (this->mProfile).
                   super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        newLineIfNeeded_abi_cxx11_(&local_30,this);
        GeneratorProfile::implementationVoiInfoString_abi_cxx11_
                  (&local_70,
                   (this->mProfile).
                   super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"[CODE]",&local_161);
        generateVariableInfoEntryCode(&local_b0,this,&local_150,&local_110,&local_130,&local_f0);
        replace(&local_50,&local_70,&local_90,&local_b0);
        std::operator+(&local_d0,&local_30,&local_50);
        std::__cxx11::string::append((string *)&this->mCode);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_30);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_150);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
        return;
      }
      std::__cxx11::string::~string((string *)&local_110);
    }
    std::__cxx11::string::~string((string *)&local_150);
  }
  return;
}

Assistant:

void Generator::GeneratorImpl::addImplementationVoiInfoCode()
{
    if (modelHasOdes()
        && !mProfile->implementationVoiInfoString().empty()
        && !mProfile->variableInfoEntryString().empty()
        && !mProfile->variableOfIntegrationVariableTypeString().empty()) {
        auto voiVariable = mModel->voi()->variable();
        auto name = voiVariable->name();
        auto units = voiVariable->units()->name();
        auto component = owningComponent(voiVariable)->name();
        auto type = mProfile->variableOfIntegrationVariableTypeString();

        mCode += newLineIfNeeded()
                 + replace(mProfile->implementationVoiInfoString(),
                           "[CODE]", generateVariableInfoEntryCode(name, units, component, type));
    }
}